

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

void __thiscall crnlib::symbol_codec::arith_stop_encoding(symbol_codec *this)

{
  uint *puVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  if (this->m_arith_total_bits != 0) {
    bVar7 = 0x2000000 < this->m_arith_length;
    uVar6 = 0x8000;
    if (bVar7) {
      uVar6 = 0x800000;
    }
    uVar3 = (uint)bVar7 * 0x800000 + 0x800000;
    puVar1 = &this->m_arith_base;
    uVar4 = *puVar1;
    *puVar1 = *puVar1 + uVar3;
    this->m_arith_length = uVar6;
    if ((CARRY4(uVar4,uVar3)) &&
       (uVar4 = (this->m_arith_output_buf).m_size, uVar5 = (ulong)uVar4, -1 < (int)(uVar4 - 1))) {
      do {
        uVar4 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar4;
        puVar2 = (this->m_arith_output_buf).m_p;
        if (puVar2[uVar5] != 0xff) {
          puVar2[uVar5] = puVar2[uVar5] + '\x01';
          break;
        }
        puVar2[uVar5] = '\0';
      } while (0 < (int)uVar4);
    }
    arith_renorm_enc_interval(this);
    uVar4 = (this->m_arith_output_buf).m_size;
    if (uVar4 < 4) {
      do {
        if ((this->m_arith_output_buf).m_capacity <= uVar4) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_arith_output_buf,uVar4 + 1,true,1,
                     (object_mover)0x0,false);
          uVar4 = (this->m_arith_output_buf).m_size;
        }
        (this->m_arith_output_buf).m_p[uVar4] = '\0';
        uVar4 = (this->m_arith_output_buf).m_size + 1;
        (this->m_arith_output_buf).m_size = uVar4;
        this->m_total_bits_written = this->m_total_bits_written + 8;
      } while (uVar4 < 4);
    }
  }
  return;
}

Assistant:

void symbol_codec::arith_stop_encoding()
    {
        if (!m_arith_total_bits)
        {
            return;
        }

        uint orig_base = m_arith_base;

        if (m_arith_length > 2 * cSymbolCodecArithMinLen)
        {
            m_arith_base += cSymbolCodecArithMinLen;
            m_arith_length = (cSymbolCodecArithMinLen >> 1);
        }
        else
        {
            m_arith_base += (cSymbolCodecArithMinLen >> 1);
            m_arith_length = (cSymbolCodecArithMinLen >> 9);
        }

        if (orig_base > m_arith_base)
        {
            arith_propagate_carry();
        }

        arith_renorm_enc_interval();

        while (m_arith_output_buf.size() < 4)
        {
            m_arith_output_buf.push_back(0);
            m_total_bits_written += 8;
        }
    }